

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsembleValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)302>(Result *__return_storage_ptr__,Model *format)

{
  TreeEnsembles local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  TreeEnsembles::constructAndValidateTreeEnsembleFromSpec(local_20,format);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_treeEnsembleRegressor>(const Specification::Model& format) {
        try {
            TreeEnsembles::constructAndValidateTreeEnsembleFromSpec(format);
            
        } catch (const std::logic_error& error) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, error.what());
        }
        
        return Result();
    }